

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O3

MPP_RET mpp_node_deinit(MppNode node)

{
  if (node != (MppNode)0x0) {
    if (*(int *)((long)node + 0x4c) != 0) {
      mpp_node_task_detach((MppNodeTask *)((long)node + 0x70));
      if (*(int *)((long)node + 0x4c) != 0) {
        _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"p->attached == 0",
                   "mpp_node_deinit",0x14f);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
          abort();
        }
      }
    }
    sem_destroy((sem_t *)((long)node + 0x50));
    mpp_osal_free("mpp_node_deinit",node);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_node_deinit(MppNode node)
{
    MppNodeImpl *p = (MppNodeImpl *)node;

    if (p) {
        if (p->attached)
            mpp_node_task_detach(&p->task);

        mpp_assert(p->attached == 0);

        sem_destroy(&p->sem_detach);

        mpp_free(p);
    }

    return MPP_OK;
}